

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  uint uVar1;
  bool bVar2;
  size_t sVar3;
  uint uVar4;
  char *__s;
  bool bVar5;
  ostream *poVar6;
  undefined1 local_208 [8];
  DummyMatchResultListener dummy;
  ios_base local_198 [264];
  string local_90;
  undefined1 local_70 [8];
  string error_message;
  long local_48;
  long local_40;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  Message buffer;
  
  if (this->spawned_ != true) {
    return false;
  }
  (*(this->super_DeathTest)._vptr_DeathTest[6])(local_70,this);
  Message::Message((Message *)&local_30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_30._M_head_impl + 0x10),"Death test: ",0xc);
  __s = this->statement_;
  poVar6 = (ostream *)(local_30._M_head_impl + 0x10);
  if (__s == (char *)0x0) {
    sVar3 = 6;
    __s = "(null)";
  }
  else {
    sVar3 = strlen(__s);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,__s,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_30._M_head_impl + 0x10),"\n",1);
  switch(this->outcome_) {
  case DIED:
    if (!status_ok) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_30._M_head_impl + 0x10),
                 "    Result: died but not with expected exit code:\n",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_30._M_head_impl + 0x10),"            ",0xc);
      uVar1 = this->status_;
      Message::Message((Message *)((long)&error_message.field_2 + 8));
      uVar4 = uVar1 & 0x7f;
      if (uVar4 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(error_message.field_2._8_8_ + 0x10),"Exited with exit status ",0x18);
        std::ostream::operator<<((ostream *)(error_message.field_2._8_8_ + 0x10),uVar1 >> 8 & 0xff);
      }
      else if (0x1ffffff < (int)(uVar4 * 0x1000000 + 0x1000000)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(error_message.field_2._8_8_ + 0x10),"Terminated by signal ",0x15);
        std::ostream::operator<<((ostream *)(error_message.field_2._8_8_ + 0x10),uVar4);
      }
      if ((char)uVar1 < '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(error_message.field_2._8_8_ + 0x10)," (core dumped)",0xe);
      }
      Message::GetString_abi_cxx11_
                ((string *)local_208,(Message *)((long)&error_message.field_2 + 8));
      if (error_message.field_2._8_8_ != 0) {
        (**(code **)(*(long *)error_message.field_2._8_8_ + 8))();
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_30._M_head_impl + 0x10),(char *)local_208,
                 (long)dummy.super_MatchResultListener._vptr_MatchResultListener);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_30._M_head_impl + 0x10),"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_30._M_head_impl + 0x10),"Actual msg:\n",0xc);
      FormatDeathTestOutput((string *)((long)&error_message.field_2 + 8),(string *)local_70);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_30._M_head_impl + 0x10),(char *)error_message.field_2._8_8_,
                 local_48);
      if ((long *)error_message.field_2._8_8_ != &stack0xffffffffffffffc0) {
        operator_delete((void *)error_message.field_2._8_8_,local_40 + 1);
      }
      break;
    }
    dummy.super_MatchResultListener._vptr_MatchResultListener = (_func_int **)0x0;
    local_208 = (undefined1  [8])&PTR__MatchResultListener_00153cc8;
    bVar2 = MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            ::MatchAndExplain(&(this->matcher_).
                               super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_70,(MatchResultListener *)local_208);
    bVar5 = true;
    if (bVar2) goto LAB_001348c2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::DescribeTo(&(this->matcher_).
                  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 ,(ostream *)local_208);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_30._M_head_impl + 0x10),
               "    Result: died but not with expected error.\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_30._M_head_impl + 0x10),"  Expected: ",0xc);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_30._M_head_impl + 0x10),(char *)error_message.field_2._8_8_,
               local_48);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_30._M_head_impl + 0x10),"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_30._M_head_impl + 0x10),"Actual msg:\n",0xc);
    FormatDeathTestOutput(&local_90,(string *)local_70);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_30._M_head_impl + 0x10),local_90._M_dataplus._M_p,
               local_90._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((long *)error_message.field_2._8_8_ != &stack0xffffffffffffffc0) {
      operator_delete((void *)error_message.field_2._8_8_,local_40 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
    std::ios_base::~ios_base(local_198);
    goto LAB_001348bf;
  case LIVED:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_30._M_head_impl + 0x10),"    Result: failed to die.\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_30._M_head_impl + 0x10)," Error msg:\n",0xc);
    FormatDeathTestOutput((string *)local_208,(string *)local_70);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_30._M_head_impl + 0x10),(char *)local_208,
               (long)dummy.super_MatchResultListener._vptr_MatchResultListener);
    break;
  case RETURNED:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_30._M_head_impl + 0x10),
               "    Result: illegal return in test statement.\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_30._M_head_impl + 0x10)," Error msg:\n",0xc);
    FormatDeathTestOutput((string *)local_208,(string *)local_70);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_30._M_head_impl + 0x10),(char *)local_208,
               (long)dummy.super_MatchResultListener._vptr_MatchResultListener);
    break;
  case THREW:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_30._M_head_impl + 0x10),"    Result: threw an exception.\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_30._M_head_impl + 0x10)," Error msg:\n",0xc);
    FormatDeathTestOutput((string *)local_208,(string *)local_70);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_30._M_head_impl + 0x10),(char *)local_208,
               (long)dummy.super_MatchResultListener._vptr_MatchResultListener);
    break;
  default:
    GTestLog::GTestLog((GTestLog *)local_208,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                       ,0x26e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DeathTest::Passed somehow called before conclusion of test",
               0x3a);
    GTestLog::~GTestLog((GTestLog *)local_208);
    goto LAB_001348bf;
  }
  if (local_208 != (undefined1  [8])&dummy.super_MatchResultListener.stream_) {
    operator_delete((void *)local_208,(ulong)(dummy.super_MatchResultListener.stream_ + 1));
  }
LAB_001348bf:
  bVar5 = false;
LAB_001348c2:
  Message::GetString_abi_cxx11_((string *)local_208,(Message *)&local_30);
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if (local_208 != (undefined1  [8])&dummy.super_MatchResultListener.stream_) {
    operator_delete((void *)local_208,(ulong)(dummy.super_MatchResultListener.stream_ + 1));
  }
  if (local_30._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_30._M_head_impl + 8))();
  }
  if (local_70 != (undefined1  [8])&error_message._M_string_length) {
    operator_delete((void *)local_70,error_message._M_string_length + 1);
  }
  return bVar5;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned()) return false;

  const std::string error_message = GetErrorLogs();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n"
             << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n"
             << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n"
             << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
        if (matcher_.Matches(error_message)) {
          success = true;
        } else {
          std::ostringstream stream;
          matcher_.DescribeTo(&stream);
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << stream.str() << "\n"
                 << "Actual msg:\n"
                 << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n"
               << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}